

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

LPCWSTR __thiscall Js::ScopeVariablesGroupDisplay::Value(ScopeVariablesGroupDisplay *this,int radix)

{
  StringBuilder<Memory::ArenaAllocator> *this_00;
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  RecyclableObject *pRVar4;
  JavascriptFunction *this_01;
  FunctionBody *pFVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  FunctionInfo *this_02;
  undefined4 extraout_var_00;
  Var local_20;
  Var calleeFunc;
  Var value;
  
  bVar1 = VarIs<Js::ActivationObject>((this->super_RecyclableObjectDisplay).instance);
  if (bVar1) {
    pRVar4 = VarTo<Js::RecyclableObject>((this->super_RecyclableObjectDisplay).instance);
    calleeFunc = (Var)0x0;
    if (((((pRVar4->type).ptr)->typeId == TypeIds_ActivationObject) &&
        (BVar2 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                           (pRVar4,pRVar4,0x1cf,&calleeFunc,
                            (this->super_RecyclableObjectDisplay).scriptContext), BVar2 != 0)) &&
       (bVar1 = VarIs<Js::RecyclableObject>(calleeFunc), bVar1)) {
      pRVar4 = VarTo<Js::RecyclableObject>(calleeFunc);
      local_20 = (Var)0x0;
      BVar2 = RecyclableObjectDisplay::GetPropertyWithScriptEnter
                        (pRVar4,pRVar4,0x1ce,&local_20,
                         (this->super_RecyclableObjectDisplay).scriptContext);
      if ((BVar2 != 0) && (bVar1 = VarIs<Js::JavascriptFunction>(local_20), bVar1)) {
        this_01 = VarTo<Js::JavascriptFunction>(local_20);
        pFVar5 = JavascriptFunction::GetFunctionBody(this_01);
        if (pFVar5 != (FunctionBody *)0x0) {
          iVar3 = (*(pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(pFVar5);
          if ((char16 *)CONCAT44(extraout_var,iVar3) != (char16 *)0x0) {
            this_00 = ((this->super_RecyclableObjectDisplay).scriptContext)->threadContext->
                      debugManager->pCurrentInterpreterLocation->stringBuilder;
            this_00->length = 0;
            this_00->count = 0;
            this_00->firstChunk = (Data *)0x0;
            this_00->secondChunk = (Data *)0x0;
            this_00->lastChunk = (Data *)0x0;
            StringBuilder<Memory::ArenaAllocator>::AppendSz
                      (this_00,(char16 *)CONCAT44(extraout_var,iVar3));
            pcVar6 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
            return pcVar6;
          }
        }
      }
    }
  }
  else {
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
              ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)&calleeFunc,
               (WriteBarrierPtr<void> *)(this->super_RecyclableObjectDisplay).instance);
    bVar1 = ScopeSlots::IsDebuggerScopeSlotArray((ScopeSlots *)&calleeFunc);
    if (!bVar1) {
      this_02 = ScopeSlots::GetFunctionInfo((ScopeSlots *)&calleeFunc);
      pFVar5 = FunctionInfo::GetFunctionBody(this_02);
      iVar3 = (*(pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar5);
      return (LPCWSTR)CONCAT44(extraout_var_00,iVar3);
    }
  }
  return L"";
}

Assistant:

LPCWSTR ScopeVariablesGroupDisplay::Value(int radix)
    {
        if (VarIs<ActivationObject>(instance))
        {
            // The scope is defined by the activation object.
            Js::RecyclableObject *object = Js::VarTo<Js::RecyclableObject>(instance);
            try
            {
                // Trying to find out the JavascriptFunction from the scope.
                Var value = nullptr;
                if (object->GetTypeId() == TypeIds_ActivationObject && GetPropertyWithScriptEnter(object, object, PropertyIds::arguments, &value, scriptContext))
                {
                    if (Js::VarIs<Js::RecyclableObject>(value))
                    {
                        Js::RecyclableObject *argObject = Js::VarTo<Js::RecyclableObject>(value);
                        Var calleeFunc = nullptr;
                        if (GetPropertyWithScriptEnter(argObject, argObject, PropertyIds::callee, &calleeFunc, scriptContext) && Js::VarIs<Js::JavascriptFunction>(calleeFunc))
                        {
                            Js::JavascriptFunction *calleeFunction = Js::VarTo<Js::JavascriptFunction>(calleeFunc);
                            Js::FunctionBody *pFuncBody = calleeFunction->GetFunctionBody();

                            if (pFuncBody)
                            {
                                const char16* pDisplayName = pFuncBody->GetDisplayName();
                                if (pDisplayName)
                                {
                                    StringBuilder<ArenaAllocator>* builder = GetStringBuilder();
                                    builder->Reset();
                                    builder->AppendSz(pDisplayName);
                                    return builder->Detach();
                                }
                            }
                        }
                    }
                }
            }
            catch(const JavascriptException& err)
            {
                err.GetAndClear();  // discard exception object
            }

            return _u("");
        }
        else
        {
            // The scope is defined by a slot array object so grab the function body out to get the function name.
            ScopeSlots slotArray = ScopeSlots(reinterpret_cast<Field(Var)*>(instance));

            if(slotArray.IsDebuggerScopeSlotArray())
            {
                // handling for block/catch scope
                return _u("");
            }
            else
            {
                Js::FunctionBody *functionBody = slotArray.GetFunctionInfo()->GetFunctionBody();
                return functionBody->GetDisplayName();
            }
        }
    }